

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_equivalents_Test::TestBody(stringToUnits_equivalents_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  double in_XMM1_Qa;
  AssertHelper local_980;
  Message local_978;
  allocator local_969;
  string local_968;
  precise_unit local_948;
  allocator local_931;
  string local_930;
  precise_unit local_910;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_17;
  Message local_8e8;
  allocator local_8d9;
  string local_8d8;
  precise_unit local_8b8;
  allocator local_8a1;
  string local_8a0;
  precise_unit local_880;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_16;
  Message local_858;
  allocator local_849;
  string local_848;
  precise_unit local_828;
  allocator local_811;
  string local_810;
  precise_unit local_7f0;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_15;
  Message local_7c8;
  allocator local_7b9;
  string local_7b8;
  precise_unit local_798;
  allocator local_781;
  string local_780;
  precise_unit local_760;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_14;
  Message local_738;
  allocator local_729;
  string local_728;
  precise_unit local_708;
  allocator local_6f1;
  string local_6f0;
  precise_unit local_6d0;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_13;
  Message local_6a8;
  allocator local_699;
  string local_698;
  precise_unit local_678;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_12;
  Message local_650;
  unit local_644;
  unit local_63c;
  allocator local_631;
  string local_630;
  precise_unit local_610;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_11;
  Message local_5e8;
  allocator local_5d9;
  string local_5d8;
  precise_unit local_5b8;
  allocator local_5a1;
  string local_5a0;
  precise_unit local_580;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_10;
  Message local_558;
  allocator local_549;
  string local_548;
  precise_unit local_528;
  allocator local_511;
  string local_510;
  precise_unit local_4f0;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_9;
  Message local_4c8;
  precise_unit local_4c0;
  allocator local_4a9;
  string local_4a8;
  precise_unit local_488;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_8;
  Message local_460;
  allocator local_451;
  string local_450;
  precise_unit local_430;
  allocator local_419;
  string local_418;
  precise_unit local_3f8;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_7;
  Message local_3d0;
  allocator local_3c1;
  string local_3c0;
  precise_unit local_3a0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_6;
  Message local_378;
  allocator local_369;
  string local_368;
  precise_unit local_348;
  allocator local_331;
  string local_330;
  precise_unit local_310;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_5;
  Message local_2e8;
  allocator local_2d9;
  string local_2d8;
  precise_unit local_2b8;
  allocator local_2a1;
  string local_2a0;
  precise_unit local_280;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  allocator local_249;
  string local_248;
  precise_unit local_228;
  allocator local_211;
  string local_210;
  precise_unit local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  Message local_1c8;
  allocator local_1b9;
  string local_1b8;
  precise_unit local_198;
  allocator local_181;
  string local_180;
  precise_unit local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  allocator local_129;
  string local_128;
  precise_unit local_108;
  allocator local_f1;
  string local_f0;
  precise_unit local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  allocator local_99;
  string local_98;
  precise_unit local_78 [2];
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_equivalents_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"dB",&local_51);
  uVar2 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_50,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"decibels",&local_99);
  uVar2 = units::getDefaultFlags();
  local_78[0] = units::unit_from_string(&local_98,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"unit_from_string(\"dB\")","unit_from_string(\"decibels\")",
             &local_30,local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x360,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"daL",&local_f1);
  uVar2 = units::getDefaultFlags();
  local_d0 = units::unit_from_string(&local_f0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"dekalitres",&local_129);
  uVar2 = units::getDefaultFlags();
  local_108 = units::unit_from_string(&local_128,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_c0,"unit_from_string(\"daL\")","unit_from_string(\"dekalitres\")",
             &local_d0,&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x361,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"ug per m^3",&local_181);
  uVar2 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_180,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"ug/m3",&local_1b9);
  uVar2 = units::getDefaultFlags();
  local_198 = units::unit_from_string(&local_1b8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_150,"unit_from_string(\"ug per m^3\")","unit_from_string(\"ug/m3\")",
             &local_160,&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x362,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"10^-6 grams",&local_211);
  uVar2 = units::getDefaultFlags();
  local_1f0 = units::unit_from_string(&local_210,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"ug",&local_249);
  uVar2 = units::getDefaultFlags();
  local_228 = units::unit_from_string(&local_248,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1e0,"unit_from_string(\"10^-6 grams\")","unit_from_string(\"ug\")",
             &local_1f0,&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x363,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"10^-12 grams",&local_2a1);
  uVar2 = units::getDefaultFlags();
  local_280 = units::unit_from_string(&local_2a0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"pg",&local_2d9);
  uVar2 = units::getDefaultFlags();
  local_2b8 = units::unit_from_string(&local_2d8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_270,"unit_from_string(\"10^-12 grams\")","unit_from_string(\"pg\")",
             &local_280,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x364,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"U per 2 hrs",&local_331);
  uVar2 = units::getDefaultFlags();
  local_310 = units::unit_from_string(&local_330,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"U/(2.h)",&local_369);
  uVar2 = units::getDefaultFlags();
  local_348 = units::unit_from_string(&local_368,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_300,"unit_from_string(\"U per 2 hrs\")",
             "unit_from_string(\"U/(2.h)\")",&local_310,&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x365,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"100 m^2",&local_3c1);
  uVar2 = units::getDefaultFlags();
  local_3a0 = units::unit_from_string(&local_3c0,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_390,"unit_from_string(\"100 m^2\")","precise::area::are",&local_3a0,
             (precise_unit *)units::precise::area::are);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x366,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"/gram",&local_419);
  uVar2 = units::getDefaultFlags();
  local_3f8 = units::unit_from_string(&local_418,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"/g",&local_451);
  uVar2 = units::getDefaultFlags();
  local_430 = units::unit_from_string(&local_450,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_3e8,"unit_from_string(\"/gram\")","unit_from_string(\"/g\")",
             &local_3f8,&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x367,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8," per g",&local_4a9);
  uVar2 = units::getDefaultFlags();
  local_488 = units::unit_from_string(&local_4a8,uVar2);
  local_4c0 = units::precise_unit::inv((precise_unit *)units::precise::g);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_478,"unit_from_string(\" per g\")","precise::g.inv()",&local_488,
             &local_4c0);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x368,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"/deciliter",&local_511);
  uVar2 = units::getDefaultFlags();
  local_4f0 = units::unit_from_string(&local_510,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_548,"/dL",&local_549);
  uVar2 = units::getDefaultFlags();
  local_528 = units::unit_from_string(&local_548,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_4e0,"unit_from_string(\"/deciliter\")","unit_from_string(\"/dL\")",
             &local_4f0,&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x369,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"DM2/S2",&local_5a1);
  local_580 = units::unit_from_string(&local_5a0,0x200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"dm2/s2",&local_5d9);
  uVar2 = units::getDefaultFlags();
  local_5b8 = units::unit_from_string(&local_5d8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_570,"unit_from_string(\"DM2/S2\", case_insensitive)",
             "unit_from_string(\"dm2/s2\")",&local_580,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x36c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_630,"/cu. m",&local_631);
  uVar2 = units::getDefaultFlags();
  local_610 = units::unit_from_string(&local_630,uVar2);
  units::unit::pow((unit *)&units::m,local_610.multiplier_,in_XMM1_Qa);
  local_63c = units::unit::inv(&local_644);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::unit,_nullptr>
            ((EqHelper *)local_600,"unit_from_string(\"/cu. m\")","m.pow(3).inv()",&local_610,
             &local_63c);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x36d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"a gregorian",&local_699);
  uVar2 = units::getDefaultFlags();
  local_678 = units::unit_from_string(&local_698,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_668,"unit_from_string(\"a gregorian\")","precise::time::ag",
             &local_678,(precise_unit *)units::precise::time::ag);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x36e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f0,"cubic inches",&local_6f1);
  uVar2 = units::getDefaultFlags();
  local_6d0 = units::unit_from_string(&local_6f0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_728,"[cin_i]",&local_729);
  uVar2 = units::getDefaultFlags();
  local_708 = units::unit_from_string(&local_728,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_6c0,"unit_from_string(\"cubic inches\")",
             "unit_from_string(\"[cin_i]\")",&local_6d0,&local_708);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x36f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,"/mcl",&local_781);
  uVar2 = units::getDefaultFlags();
  local_760 = units::unit_from_string(&local_780,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b8,"/uL",&local_7b9);
  uVar2 = units::getDefaultFlags();
  local_798 = units::unit_from_string(&local_7b8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_750,"unit_from_string(\"/mcl\")","unit_from_string(\"/uL\")",
             &local_760,&local_798);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_7c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x370,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_810,"/sec",&local_811);
  uVar2 = units::getDefaultFlags();
  local_7f0 = units::unit_from_string(&local_810,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_848,"/s",&local_849);
  uVar2 = units::getDefaultFlags();
  local_828 = units::unit_from_string(&local_848,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_7e0,"unit_from_string(\"/sec\")","unit_from_string(\"/s\")",
             &local_7f0,&local_828);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(&local_858);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x371,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_858);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8a0,"g.m",&local_8a1);
  uVar2 = units::getDefaultFlags();
  local_880 = units::unit_from_string(&local_8a0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d8,"gram meter",&local_8d9);
  uVar2 = units::getDefaultFlags();
  local_8b8 = units::unit_from_string(&local_8d8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_870,"unit_from_string(\"g.m\")","unit_from_string(\"gram meter\")",
             &local_880,&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x372,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_930,"gf.m",&local_931);
  uVar2 = units::getDefaultFlags();
  local_910 = units::unit_from_string(&local_930,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_968,"gram-force meter",&local_969);
  uVar2 = units::getDefaultFlags();
  local_948 = units::unit_from_string(&local_968,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_900,"unit_from_string(\"gf.m\")",
             "unit_from_string(\"gram-force meter\")",&local_910,&local_948);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x373,pcVar3);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  return;
}

Assistant:

TEST(stringToUnits, equivalents)
{
    EXPECT_EQ(unit_from_string("dB"), unit_from_string("decibels"));
    EXPECT_EQ(unit_from_string("daL"), unit_from_string("dekalitres"));
    EXPECT_EQ(unit_from_string("ug per m^3"), unit_from_string("ug/m3"));
    EXPECT_EQ(unit_from_string("10^-6 grams"), unit_from_string("ug"));
    EXPECT_EQ(unit_from_string("10^-12 grams"), unit_from_string("pg"));
    EXPECT_EQ(unit_from_string("U per 2 hrs"), unit_from_string("U/(2.h)"));
    EXPECT_EQ(unit_from_string("100 m^2"), precise::area::are);
    EXPECT_EQ(unit_from_string("/gram"), unit_from_string("/g"));
    EXPECT_EQ(unit_from_string(" per g"), precise::g.inv());
    EXPECT_EQ(unit_from_string("/deciliter"), unit_from_string("/dL"));
    EXPECT_EQ(
        unit_from_string("DM2/S2", case_insensitive),
        unit_from_string("dm2/s2"));
    EXPECT_EQ(unit_from_string("/cu. m"), m.pow(3).inv());
    EXPECT_EQ(unit_from_string("a gregorian"), precise::time::ag);
    EXPECT_EQ(unit_from_string("cubic inches"), unit_from_string("[cin_i]"));
    EXPECT_EQ(unit_from_string("/mcl"), unit_from_string("/uL"));
    EXPECT_EQ(unit_from_string("/sec"), unit_from_string("/s"));
    EXPECT_EQ(unit_from_string("g.m"), unit_from_string("gram meter"));
    EXPECT_EQ(unit_from_string("gf.m"), unit_from_string("gram-force meter"));
}